

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

uint8_t * js_load_file(JSContext *ctx,size_t *pbuf_len,char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  int *piVar2;
  uint8_t *__ptr;
  size_t sVar3;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    iVar1 = fseek(__stream,0,2);
    if ((-1 < iVar1) && (__n = ftell(__stream), -1 < (long)__n)) {
      if (__n == 0x7fffffffffffffff) {
        piVar2 = __errno_location();
        *piVar2 = 0x15;
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (-1 < iVar1) {
          if (ctx == (JSContext *)0x0) {
            __ptr = (uint8_t *)malloc(__n + 1);
          }
          else {
            __ptr = (uint8_t *)js_malloc(ctx,__n + 1);
          }
          if (__ptr != (uint8_t *)0x0) {
            sVar3 = fread(__ptr,1,__n,__stream);
            if (sVar3 == __n) {
              __ptr[__n] = '\0';
              fclose(__stream);
              *pbuf_len = __n;
              return __ptr;
            }
            piVar2 = __errno_location();
            *piVar2 = 5;
            if (ctx == (JSContext *)0x0) {
              free(__ptr);
            }
            else {
              js_free(ctx,__ptr);
            }
          }
        }
      }
    }
    fclose(__stream);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *js_load_file(JSContext *ctx, size_t *pbuf_len, const char *filename)
{
    FILE *f;
    uint8_t *buf;
    size_t buf_len;
    long lret;
    
    f = fopen(filename, "rb");
    if (!f)
        return NULL;
    if (fseek(f, 0, SEEK_END) < 0)
        goto fail;
    lret = ftell(f);
    if (lret < 0)
        goto fail;
    /* XXX: on Linux, ftell() return LONG_MAX for directories */
    if (lret == LONG_MAX) {
        errno = EISDIR;
        goto fail;
    }
    buf_len = lret;
    if (fseek(f, 0, SEEK_SET) < 0)
        goto fail;
    if (ctx)
        buf = js_malloc(ctx, buf_len + 1);
    else
        buf = malloc(buf_len + 1);
    if (!buf)
        goto fail;
    if (fread(buf, 1, buf_len, f) != buf_len) {
        errno = EIO;
        if (ctx)
            js_free(ctx, buf);
        else
            free(buf);
    fail:
        fclose(f);
        return NULL;
    }
    buf[buf_len] = '\0';
    fclose(f);
    *pbuf_len = buf_len;
    return buf;
}